

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixot.cpp
# Opt level: O3

void __thiscall
TPZStructMatrixOT<std::complex<double>_>::Serial_Assemble
          (TPZStructMatrixOT<std::complex<double>_> *this,TPZBaseMatrix *stiff_base,
          TPZBaseMatrix *rhs_base,TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  TPZCompMesh *mesh;
  long lVar1;
  TPZCompEl *pTVar2;
  TPZGuiInterface *this_00;
  char cVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  TPZCompEl **ppTVar7;
  long *plVar8;
  long *plVar9;
  long lVar10;
  long lVar11;
  long nelem;
  TPZFMatrix<std::complex<double>_> *rhs;
  TPZManVector<long,_10> *orig;
  TPZTimer assemble;
  TPZTimer calcstiff;
  TPZElementMatrixT<std::complex<double>_> ek;
  TPZElementMatrixT<std::complex<double>_> ef;
  char cStack_104f1;
  TPZStructMatrixOT<std::complex<double>_> *pTStack_104f0;
  long lStack_104e8;
  long lStack_104e0;
  TPZEquationFilter *pTStack_104d8;
  long *plStack_104d0;
  long lStack_104c8;
  TPZFMatrix<std::complex<double>_> *pTStack_104c0;
  TPZFNMatrix<1000,_std::complex<double>_> *pTStack_104b8;
  TPZFMatrix<std::complex<double>_> *pTStack_104b0;
  TPZFMatrix<std::complex<double>_> *pTStack_104a8;
  TPZFNMatrix<1000,_std::complex<double>_> *pTStack_104a0;
  TPZAutoPointer<TPZGuiInterface> *pTStack_10498;
  long *plStack_10490;
  long lStack_10488;
  long alStack_10480 [2];
  long *plStack_10470;
  long lStack_10468;
  long alStack_10460 [2];
  undefined1 auStack_10450 [32];
  _Alloc_hider _Stack_10430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_10420;
  undefined1 auStack_10410 [32];
  _Alloc_hider _Stack_103f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_103e0;
  TPZElementMatrixT<std::complex<double>_> TStack_103d0;
  TPZElementMatrixT<std::complex<double>_> local_8200;
  
  pTStack_104f0 = this;
  pTStack_10498 = guiInterface;
  lVar6 = __dynamic_cast(stiff_base,&TPZBaseMatrix::typeinfo,
                         &TPZMatrix<std::complex<double>>::typeinfo,0);
  if ((lVar6 == 0) ||
     (lVar6 = __dynamic_cast(rhs_base,&TPZBaseMatrix::typeinfo,
                             &TPZFMatrix<std::complex<double>>::typeinfo,0), lVar6 == 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "virtual void TPZStructMatrixOT<std::complex<double>>::Serial_Assemble(TPZBaseMatrix &, TPZBaseMatrix &, TPZAutoPointer<TPZGuiInterface>) [TVar = std::complex<double>]"
               ,0xa6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,": incompatible types. Aborting...\n",0x22);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/pzstrmatrixot.cpp"
               ,0xd0);
  }
  lVar6 = __dynamic_cast(pTStack_104f0,&TPZStructMatrixOT<std::complex<double>>::typeinfo,
                         &TPZStructMatrix::typeinfo,0xfffffffffffffffe);
  mesh = *(TPZCompMesh **)(lVar6 + 8);
  plStack_104d0 =
       (long *)__dynamic_cast(stiff_base,&TPZBaseMatrix::typeinfo,
                              &TPZMatrix<std::complex<double>>::typeinfo,0);
  if ((plStack_104d0 == (long *)0x0) ||
     (pTStack_104b0 =
           (TPZFMatrix<std::complex<double>_> *)
           __dynamic_cast(rhs_base,&TPZBaseMatrix::typeinfo,
                          &TPZFMatrix<std::complex<double>>::typeinfo,0),
     pTStack_104b0 == (TPZFMatrix<std::complex<double>_> *)0x0)) {
    __cxa_bad_cast();
  }
  if (mesh == (TPZCompMesh *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Serial_Assemble called without mesh",0x23);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/pzstrmatrixot.cpp"
               ,0xdb);
  }
  lVar1 = (mesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  TPZElementMatrixT<std::complex<double>_>::TPZElementMatrixT(&TStack_103d0,mesh,EK);
  TPZElementMatrixT<std::complex<double>_>::TPZElementMatrixT(&local_8200,mesh,EF);
  plStack_10470 = alStack_10460;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&plStack_10470,"Computing the stiffness matrices","");
  auStack_10410._24_8_ = 0.0;
  _Stack_103f0._M_p = (pointer)&aStack_103e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&_Stack_103f0,plStack_10470,lStack_10468 + (long)plStack_10470);
  if (plStack_10470 != alStack_10460) {
    operator_delete(plStack_10470,alStack_10460[0] + 1);
  }
  plStack_10490 = alStack_10480;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&plStack_10490,"Assembling the stiffness matrices","");
  auStack_10450._24_8_ = 0.0;
  _Stack_10430._M_p = (pointer)&aStack_10420;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&_Stack_10430,plStack_10490,lStack_10488 + (long)plStack_10490);
  if (plStack_10490 != alStack_10480) {
    operator_delete(plStack_10490,alStack_10480[0] + 1);
  }
  if (0 < lVar1) {
    pTStack_104d8 = (TPZEquationFilter *)(lVar6 + 0x48);
    lStack_104c8 = lVar6 + 0x18;
    lStack_104e0 = lVar6 + 0x20;
    pTStack_104a0 = &TStack_103d0.fConstrMat;
    pTStack_104a8 = &local_8200.fConstrMat.super_TPZFMatrix<std::complex<double>_>;
    pTStack_104b8 = &TStack_103d0.fMat;
    pTStack_104c0 = &local_8200.fMat.super_TPZFMatrix<std::complex<double>_>;
    nelem = 0;
    lStack_104e8 = 0;
    do {
      ppTVar7 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(mesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
      pTVar2 = *ppTVar7;
      if (pTVar2 == (TPZCompEl *)0x0) goto LAB_0134570e;
      if (*(int *)(lVar6 + 0x40) == 0) {
LAB_013454fb:
        orig = &TStack_103d0.super_TPZElementMatrix.fSourceIndex;
        lStack_104e8 = lStack_104e8 + 1;
        if ((lStack_104e8 * 0x1cac083126e978d5 + 0x10624dd2f1a9fb8U >> 3 |
            lStack_104e8 * 0x1cac083126e978d5 << 0x3d) < 0x4189374bc6a7ef) {
          cStack_104f1 = '*';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&cStack_104f1,1);
          std::ostream::flush();
        }
        if ((lStack_104e8 * -0x2d77318fc504816f + 0x346dc5d6388640U >> 5 |
            lStack_104e8 * -0x2d77318fc504816f << 0x3b) < 0x346dc5d638865) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        }
        TPZTimer::start((TPZTimer *)auStack_10410);
        (**(code **)(*(long *)pTVar2 + 0x110))(pTVar2,&TStack_103d0,&local_8200);
        if (((pTStack_10498->fRef != (TPZReference *)0x0) &&
            (this_00 = pTStack_10498->fRef->fPointer, this_00 != (TPZGuiInterface *)0x0)) &&
           (bVar4 = TPZGuiInterface::AmIKilled(this_00), bVar4)) break;
        TPZTimer::stop((TPZTimer *)auStack_10410);
        TPZTimer::start((TPZTimer *)auStack_10450);
        iVar5 = (**(code **)(*(long *)pTVar2 + 0x1f0))(pTVar2);
        if (iVar5 == 0) {
          TPZElementMatrix::ComputeDestinationIndices(&TStack_103d0.super_TPZElementMatrix);
          TPZEquationFilter::Filter
                    (pTStack_104d8,&orig->super_TPZVec<long>,
                     &TStack_103d0.super_TPZElementMatrix.fDestinationIndex.super_TPZVec<long>);
          (**(code **)(*plStack_104d0 + 0x1a0))
                    (plStack_104d0,pTStack_104b8,orig,
                     &TStack_103d0.super_TPZElementMatrix.fDestinationIndex);
          rhs = pTStack_104c0;
          if (*(char *)((long)&(pTStack_104f0->fElBlocked)._vptr_TPZVec +
                       *(long *)(*(long *)pTStack_104f0 + -0x60) + 4) != '\0') goto LAB_013456ec;
        }
        else {
          TPZElementMatrixT<std::complex<double>_>::ApplyConstraints(&TStack_103d0);
          TPZElementMatrixT<std::complex<double>_>::ApplyConstraints(&local_8200);
          TPZElementMatrix::ComputeDestinationIndices(&TStack_103d0.super_TPZElementMatrix);
          TPZEquationFilter::Filter
                    (pTStack_104d8,&orig->super_TPZVec<long>,
                     &TStack_103d0.super_TPZElementMatrix.fDestinationIndex.super_TPZVec<long>);
          (**(code **)(*plStack_104d0 + 0x1a0))
                    (plStack_104d0,pTStack_104a0,orig,
                     &TStack_103d0.super_TPZElementMatrix.fDestinationIndex);
          rhs = pTStack_104a8;
          if (*(char *)((long)&(pTStack_104f0->fElBlocked)._vptr_TPZVec +
                       *(long *)(*(long *)pTStack_104f0 + -0x60) + 4) == '\x01') {
LAB_013456ec:
            TPZFMatrix<std::complex<double>_>::AddFel
                      (pTStack_104b0,rhs,&orig->super_TPZVec<long>,
                       &TStack_103d0.super_TPZElementMatrix.fDestinationIndex.super_TPZVec<long>);
          }
        }
        TPZTimer::stop((TPZTimer *)auStack_10450);
      }
      else {
        plVar8 = (long *)(**(code **)(*(long *)pTVar2 + 0xb8))(pTVar2);
        plVar9 = (long *)__dynamic_cast(pTVar2,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,0x918)
        ;
        if (plVar8 == (long *)0x0) {
          if ((plVar9 == (long *)0x0) ||
             (cVar3 = (**(code **)(*plVar9 + 0x140))(plVar9,lStack_104c8), cVar3 == '\0'))
          goto LAB_0134570e;
          goto LAB_013454fb;
        }
        iVar5 = (**(code **)(*plVar8 + 0x58))(plVar8);
        if (*(int *)(lVar6 + 0x40) == 0) goto LAB_013454fb;
        lVar10 = *(long *)(lVar6 + 0x28);
        lVar11 = lStack_104e0;
        if (lVar10 != 0) {
          do {
            if (iVar5 <= *(int *)(lVar10 + 0x20)) {
              lVar11 = lVar10;
            }
            lVar10 = *(long *)(lVar10 + 0x10 + (ulong)(*(int *)(lVar10 + 0x20) < iVar5) * 8);
          } while (lVar10 != 0);
          if ((lVar11 != lStack_104e0) && (*(int *)(lVar11 + 0x20) <= iVar5)) goto LAB_013454fb;
        }
      }
LAB_0134570e:
      nelem = nelem + 1;
    } while (nelem != lVar1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Stack_10430._M_p != &aStack_10420) {
    operator_delete(_Stack_10430._M_p,aStack_10420._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Stack_103f0._M_p != &aStack_103e0) {
    operator_delete(_Stack_103f0._M_p,aStack_103e0._M_allocated_capacity + 1);
  }
  local_8200.super_TPZElementMatrix._vptr_TPZElementMatrix =
       (_func_int **)&PTR__TPZElementMatrixT_01925f08;
  TPZBlock::~TPZBlock(&local_8200.fConstrBlock);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix
            (&local_8200.fConstrMat.super_TPZFMatrix<std::complex<double>_>,&PTR_PTR_01860658);
  TPZBlock::~TPZBlock(&local_8200.fBlock);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix
            (&local_8200.fMat.super_TPZFMatrix<std::complex<double>_>,&PTR_PTR_01860658);
  TPZElementMatrix::~TPZElementMatrix(&local_8200.super_TPZElementMatrix);
  TStack_103d0.super_TPZElementMatrix._vptr_TPZElementMatrix =
       (_func_int **)&PTR__TPZElementMatrixT_01925f08;
  TPZBlock::~TPZBlock(&TStack_103d0.fConstrBlock);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix
            (&TStack_103d0.fConstrMat.super_TPZFMatrix<std::complex<double>_>,&PTR_PTR_01860658);
  TPZBlock::~TPZBlock(&TStack_103d0.fBlock);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix
            (&TStack_103d0.fMat.super_TPZFMatrix<std::complex<double>_>,&PTR_PTR_01860658);
  TPZElementMatrix::~TPZElementMatrix(&TStack_103d0.super_TPZElementMatrix);
  return;
}

Assistant:

void TPZStructMatrixOT<TVar>::Serial_Assemble(TPZBaseMatrix & stiff_base, TPZBaseMatrix & rhs_base, TPZAutoPointer<TPZGuiInterface> guiInterface ){
    if(!dynamic_cast<TPZMatrix<TVar>*>(&stiff_base)||
       !dynamic_cast<TPZFMatrix<TVar>*>(&rhs_base)){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<": incompatible types. Aborting...\n";
        DebugStop();
    }
    auto *myself = dynamic_cast<TPZStructMatrix*>(this);
    auto *cmesh = myself->Mesh();
    const auto &equationFilter = myself->EquationFilter();
    auto &materialIds = myself->MaterialIds();
    
    auto &stiffness = dynamic_cast<TPZMatrix<TVar>&>(stiff_base);
    auto &rhs = dynamic_cast<TPZFMatrix<TVar>&>(rhs_base);
    if(!cmesh){
        LOGPZ_ERROR(logger,"Serial_Assemble called without mesh")
        DebugStop();
    }
#ifdef PZ_LOG
    if(dynamic_cast<TPZSubCompMesh * >(cmesh))
    {
        std::stringstream sout;
        sout << "AllEig = {};";
        LOGPZ_DEBUG(loggerelmat,sout.str())
        
    }
#endif
#ifdef PZDEBUG
    if (ComputeRhs() && rhs.Rows() != equationFilter.NActiveEquations()) {
        DebugStop();
    }
#endif
    
    int64_t iel;
    int64_t nelem = cmesh->NElements();
    TPZElementMatrixT<TVar> ek(cmesh, TPZElementMatrix::EK),ef(cmesh, TPZElementMatrix::EF);
#ifdef PZ_LOG
    bool globalresult = true;
    bool writereadresult = true;
#endif
    TPZTimer calcstiff("Computing the stiffness matrices");
    TPZTimer assemble("Assembling the stiffness matrices");
    TPZAdmChunkVector<TPZCompEl *> &elementvec = cmesh->ElementVec();
    
    int64_t count = 0;
    for(iel=0; iel < nelem; iel++) {
        TPZCompEl *el = elementvec[iel];
        if(!el) continue;
        int matidsize = materialIds.size();
        if(matidsize){
            TPZMaterial * mat = el->Material();
            TPZSubCompMesh *submesh = dynamic_cast<TPZSubCompMesh *> (el);
            if (!mat)
            {
                if (!submesh) {
                    continue;
                }
                else if(submesh->NeedsComputing(materialIds) == false) continue;
            }
            else
            {
                int matid = mat->Id();
                if (myself->ShouldCompute(matid) == false) continue;
            }
        }
        
        count++;
        if(!(count%1000))
        {
            std::cout << '*';
            std::cout.flush();
        }
        if(!(count%20000))
        {
            std::cout << "\n";
        }
        calcstiff.start();
        
        el->CalcStiff(ek,ef);
        
        if(guiInterface) if(guiInterface->AmIKilled()){
            return;
        }
        
#ifdef PZ_LOG
        if(dynamic_cast<TPZSubCompMesh * >(cmesh))
        {
            std::stringstream objname;
            objname << "Element" << iel;
            std::string name = objname.str();
            objname << " = ";
            std::stringstream sout;
            ek.fMat.Print(objname.str().c_str(),sout,EMathematicaInput);
            sout << "AppendTo[AllEig,Eigenvalues[" << name << "]];";
            
            LOGPZ_DEBUG(loggerelmat,sout.str())
            /*		  if(iel == 133)
             {
             std::stringstream sout2;
             el->Reference()->Print(sout2);
             el->Print(sout2);
             LOGPZ_DEBUG(logger,sout2.str())
             }
             */
        }
        
#endif
        
#ifdef CHECKCONSISTENCY
        //extern TPZCheckConsistency stiffconsist("ElementStiff");
        stiffconsist.SetOverWrite(true);
        bool result;
        result = stiffconsist.CheckObject(ek.fMat);
        if(!result)
        {
            globalresult = false;
            std::stringstream sout;
            sout << "element " << iel << " computed differently";
            LOGPZ_ERROR(loggerCheck,sout.str())
        }
        
#endif
        
        calcstiff.stop();
        assemble.start();
        
        if(!el->HasDependency()) {
            ek.ComputeDestinationIndices();
            equationFilter.Filter(ek.fSourceIndex, ek.fDestinationIndex);
            //			TPZSFMatrix<TVar> test(stiffness);
            //			TPZFMatrix<TVar> test2(stiffness.Rows(),stiffness.Cols(),0.);
            //			stiffness.Print("before assembly",std::cout,EMathematicaInput);
            stiffness.AddKel(ek.fMat,ek.fSourceIndex,ek.fDestinationIndex);
            if(ComputeRhs())rhs.AddFel(ef.fMat,ek.fSourceIndex,ek.fDestinationIndex);
            //			stiffness.Print("stiffness after assembly STK = ",std::cout,EMathematicaInput);
            //			rhs.Print("rhs after assembly Rhs = ",std::cout,EMathematicaInput);
            //			test2.AddKel(ek.fMat,ek.fSourceIndex,ek.fDestinationIndex);
            //			test -= stiffness;
            //			test.Print("matriz de rigidez diference",std::cout);
            //			test2.Print("matriz de rigidez interface",std::cout);
            
#ifdef PZ_LOG
            if(loggerel.isDebugEnabled())
            {
                std::stringstream sout;
                TPZGeoEl *gel = el->Reference();
                if(gel)
                {
                    TPZManVector<REAL> center(gel->Dimension()),xcenter(3,0.);
                    gel->CenterPoint(gel->NSides()-1, center);
                    gel->X(center, xcenter);
                    sout << "Stiffness for computational element index " << el->Index() << std::endl;
                    sout << "Stiffness for geometric element " << gel->Index() << " center " << xcenter << std::endl;
                }
                else {
                    sout << "Stiffness for computational element without associated geometric element\n";
                }
                ek.Print(sout);
                if(ComputeRhs())ef.Print(sout);
                LOGPZ_DEBUG(loggerel,sout.str())
            }
#endif
        } else {
            // the element has dependent nodes
            ek.ApplyConstraints();
            ef.ApplyConstraints();
            ek.ComputeDestinationIndices();
            equationFilter.Filter(ek.fSourceIndex, ek.fDestinationIndex);
            stiffness.AddKel(ek.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
            if(ComputeRhs())rhs.AddFel(ef.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
#ifdef PZ_LOG
            if(loggerel.isDebugEnabled() && ! dynamic_cast<TPZSubCompMesh *>(cmesh))
            {
                std::stringstream sout;
                TPZGeoEl *gel = el->Reference();
                TPZManVector<REAL> center(gel->Dimension()),xcenter(3,0.);
                gel->CenterPoint(gel->NSides()-1, center);
                gel->X(center, xcenter);
                sout << "Stiffness for geometric element " << gel->Index() << " center " << xcenter << std::endl;
                ek.Print(sout);
                ef.Print(sout);
                LOGPZ_DEBUG(loggerel,sout.str())
            }
#endif
        }
        
        assemble.stop();
    }//fim for iel
    
#ifdef PZ_LOG
    if(loggerCheck.isDebugEnabled())
    {
        std::stringstream sout;
        sout << "The comparaison results are : consistency check " << globalresult << " write read check " << writereadresult;
        //stiffness.Print("Matriz de Rigidez: ",sout);
        stiffness.Print("Matriz de Rigidez: ",sout,EMathematicaInput);
        if(ComputeRhs()) rhs.Print("Right Handside", sout,EMathematicaInput);
        LOGPZ_DEBUG(loggerCheck,sout.str())
    }
    
#endif
    
}